

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_xts_hw.c
# Opt level: O0

int cipher_hw_aes_xts_generic_initkey(PROV_CIPHER_CTX *ctx,uchar *key,size_t keylen)

{
  ulong uVar1;
  ulong in_RDX;
  int bits_00;
  uchar *in_RSI;
  long in_RDI;
  size_t bits_1;
  size_t bytes_1;
  size_t bits;
  size_t bytes;
  OSSL_xts_stream_fn stream_dec;
  OSSL_xts_stream_fn stream_enc;
  PROV_AES_XTS_CTX *xctx;
  code *local_68;
  code *local_38;
  code *local_30;
  
  local_30 = (code *)0x0;
  local_38 = (code *)0x0;
  if ((DAT_005e9d1c & 0x200) == 0) {
    if ((DAT_005e9d1c & 0x200) != 0) {
      uVar1 = (in_RDX >> 1) << 3;
      if ((*(byte *)(in_RDI + 0x3c) >> 1 & 1) == 0) {
        vpaes_set_decrypt_key(in_RSI,uVar1 & 0xffffffff,in_RDI + 0xc0);
        *(code **)(in_RDI + 0x2c0) = vpaes_decrypt;
      }
      else {
        vpaes_set_encrypt_key(in_RSI,uVar1 & 0xffffffff,in_RDI + 0xc0);
        *(code **)(in_RDI + 0x2c0) = vpaes_encrypt;
      }
      vpaes_set_encrypt_key(in_RSI + (in_RDX >> 1),uVar1 & 0xffffffff,in_RDI + 0x1b8);
      *(code **)(in_RDI + 0x2c8) = vpaes_encrypt;
      *(long *)(in_RDI + 0x2b0) = in_RDI + 0xc0;
      *(long *)(in_RDI + 0x2b8) = in_RDI + 0x1b8;
      *(undefined8 *)(in_RDI + 0x2d0) = 0;
      return 1;
    }
  }
  else {
    local_30 = ossl_bsaes_xts_encrypt;
    local_38 = ossl_bsaes_xts_decrypt;
  }
  bits_00 = (int)((in_RDX >> 1) << 3);
  if ((*(byte *)(in_RDI + 0x3c) >> 1 & 1) == 0) {
    AES_set_decrypt_key(in_RSI,bits_00,(AES_KEY *)(in_RDI + 0xc0));
    *(code **)(in_RDI + 0x2c0) = AES_decrypt;
  }
  else {
    AES_set_encrypt_key(in_RSI,bits_00,(AES_KEY *)(in_RDI + 0xc0));
    *(code **)(in_RDI + 0x2c0) = AES_encrypt;
  }
  AES_set_encrypt_key(in_RSI + (in_RDX >> 1),bits_00,(AES_KEY *)(in_RDI + 0x1b8));
  *(code **)(in_RDI + 0x2c8) = AES_encrypt;
  *(long *)(in_RDI + 0x2b0) = in_RDI + 0xc0;
  *(long *)(in_RDI + 0x2b8) = in_RDI + 0x1b8;
  if ((*(byte *)(in_RDI + 0x3c) >> 1 & 1) == 0) {
    local_68 = local_38;
  }
  else {
    local_68 = local_30;
  }
  *(code **)(in_RDI + 0x2d0) = local_68;
  return 1;
}

Assistant:

static int cipher_hw_aes_xts_generic_initkey(PROV_CIPHER_CTX *ctx,
                                             const unsigned char *key,
                                             size_t keylen)
{
    PROV_AES_XTS_CTX *xctx = (PROV_AES_XTS_CTX *)ctx;
    OSSL_xts_stream_fn stream_enc = NULL;
    OSSL_xts_stream_fn stream_dec = NULL;

#ifdef AES_XTS_ASM
    stream_enc = AES_xts_encrypt;
    stream_dec = AES_xts_decrypt;
#endif /* AES_XTS_ASM */

#ifdef HWAES_CAPABLE
    if (HWAES_CAPABLE) {
# ifdef HWAES_xts_encrypt
        stream_enc = HWAES_xts_encrypt;
# endif /* HWAES_xts_encrypt */
# ifdef HWAES_xts_decrypt
        stream_dec = HWAES_xts_decrypt;
# endif /* HWAES_xts_decrypt */
        XTS_SET_KEY_FN(HWAES_set_encrypt_key, HWAES_set_decrypt_key,
                       HWAES_encrypt, HWAES_decrypt,
                       stream_enc, stream_dec);
        return 1;
    } else
#endif /* HWAES_CAPABLE */

#ifdef BSAES_CAPABLE
    if (BSAES_CAPABLE) {
        stream_enc = ossl_bsaes_xts_encrypt;
        stream_dec = ossl_bsaes_xts_decrypt;
    } else
#endif /* BSAES_CAPABLE */
#ifdef VPAES_CAPABLE
    if (VPAES_CAPABLE) {
        XTS_SET_KEY_FN(vpaes_set_encrypt_key, vpaes_set_decrypt_key,
                       vpaes_encrypt, vpaes_decrypt, stream_enc, stream_dec);
        return 1;
    } else
#endif /* VPAES_CAPABLE */
    {
        (void)0;
    }
    {
        XTS_SET_KEY_FN(AES_set_encrypt_key, AES_set_decrypt_key,
                       AES_encrypt, AES_decrypt, stream_enc, stream_dec);
    }
    return 1;
}